

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemViewPrivate::clearOrRemove(QAbstractItemViewPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  iterator *rhs;
  qsizetype qVar4;
  const_reference pQVar5;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int count;
  Iterator it_1;
  QMap<int,_QVariant> roles;
  QModelIndex index;
  QModelIndexList list;
  QModelIndex parent;
  const_iterator it;
  QItemSelection selection;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  QVariant *in_stack_ffffffffffffff28;
  long *plVar6;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int local_c0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  QAbstractItemModel *local_80;
  QList<QModelIndex> local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  const_iterator local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x80fd94);
  QItemSelectionModel::selection();
  local_48.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QItemSelectionRange>::constBegin
                       ((QList<QItemSelectionRange> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if ((*(byte *)(in_RDI + 0x3e4) & 1) == 0) {
    while( true ) {
      o = QList<QItemSelectionRange>::constEnd
                    ((QList<QItemSelectionRange> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_48,o);
      if (!bVar1) break;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QItemSelectionRange>::const_iterator::operator*(&local_48);
      QItemSelectionRange::parent
                ((QItemSelectionRange *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      QList<QItemSelectionRange>::const_iterator::operator*(&local_48);
      iVar2 = QItemSelectionRange::left((QItemSelectionRange *)0x80fe6b);
      if (iVar2 == 0) {
        QList<QItemSelectionRange>::const_iterator::operator*(&local_48);
        iVar2 = QItemSelectionRange::right((QItemSelectionRange *)0x80fe8a);
        iVar3 = (**(code **)(**(long **)(in_RDI + 0x2f8) + 0x80))
                          (*(long **)(in_RDI + 0x2f8),&local_60);
        if (iVar2 == iVar3 + -1) {
          QList<QItemSelectionRange>::const_iterator::operator*(&local_48);
          in_stack_ffffffffffffff24 = QItemSelectionRange::bottom((QItemSelectionRange *)0x80fed1);
          QList<QItemSelectionRange>::const_iterator::operator*(&local_48);
          iVar2 = QItemSelectionRange::top((QItemSelectionRange *)0x80feea);
          iVar2 = in_stack_ffffffffffffff24 - iVar2;
          plVar6 = *(long **)(in_RDI + 0x2f8);
          QList<QItemSelectionRange>::const_iterator::operator*(&local_48);
          iVar3 = QItemSelectionRange::top((QItemSelectionRange *)0x80ff1f);
          (**(code **)(*plVar6 + 0x108))(plVar6,iVar3,iVar2 + 1,&local_60);
        }
      }
      QList<QItemSelectionRange>::const_iterator::operator++(&local_48);
    }
  }
  else {
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::indexes();
    local_c0 = 0;
    while( true ) {
      rhs = (iterator *)(long)local_c0;
      qVar4 = QList<QModelIndex>::size(&local_78);
      if (qVar4 <= (long)rhs) break;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = QList<QModelIndex>::at
                         ((QList<QModelIndex> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          (qsizetype)rhs);
      local_90 = *(undefined1 **)pQVar5;
      local_88 = (undefined1 *)pQVar5->i;
      local_80 = (pQVar5->m).ptr;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(**(long **)(in_RDI + 0x2f8) + 0xb0))
                (&local_98,*(long **)(in_RDI + 0x2f8),&local_90);
      QMap<int,_QVariant>::begin
                ((QMap<int,_QVariant> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      while( true ) {
        QMap<int,_QVariant>::end
                  ((QMap<int,_QVariant> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        bVar1 = ::operator!=((iterator *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),rhs);
        if (!bVar1) break;
        ::QVariant::QVariant((QVariant *)0x81007d);
        QMap<int,_QVariant>::iterator::value((iterator *)0x810087);
        ::QVariant::operator=
                  (in_stack_ffffffffffffff28,
                   (QVariant *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        ::QVariant::~QVariant(&local_28);
        QMap<int,_QVariant>::iterator::operator++
                  ((iterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      (**(code **)(**(long **)(in_RDI + 0x2f8) + 0xb8))
                (*(long **)(in_RDI + 0x2f8),&local_90,&local_98);
      QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)0x8100d9);
      local_c0 = local_c0 + 1;
    }
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8100f3);
  }
  QItemSelection::~QItemSelection((QItemSelection *)0x810100);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::clearOrRemove()
{
#if QT_CONFIG(draganddrop)
    const QItemSelection selection = selectionModel->selection();
    QList<QItemSelectionRange>::const_iterator it = selection.constBegin();

    if (!overwrite) {
        for (; it != selection.constEnd(); ++it) {
            QModelIndex parent = (*it).parent();
            if ((*it).left() != 0)
                continue;
            if ((*it).right() != (model->columnCount(parent) - 1))
                continue;
            int count = (*it).bottom() - (*it).top() + 1;
            model->removeRows((*it).top(), count, parent);
        }
    } else {
        // we can't remove the rows so reset the items (i.e. the view is like a table)
        QModelIndexList list = selection.indexes();
        for (int i=0; i < list.size(); ++i) {
            QModelIndex index = list.at(i);
            QMap<int, QVariant> roles = model->itemData(index);
            for (QMap<int, QVariant>::Iterator it = roles.begin(); it != roles.end(); ++it)
                it.value() = QVariant();
            model->setItemData(index, roles);
        }
    }
#endif
}